

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjtalk.c
# Opt level: O0

_Bool Open_JTalk_load_voice(Open_JTalk *open_jtalk,char *fn_voice)

{
  HTS_Boolean HVar1;
  int iVar2;
  size_t sVar3;
  char *__s1;
  JPCommon *in_RSI;
  long in_RDI;
  size_t in_stack_00000018;
  char **in_stack_00000020;
  HTS_Engine *in_stack_00000028;
  
  if (((in_RDI == 0) || (in_RSI == (JPCommon *)0x0)) || (sVar3 = strlen((char *)in_RSI), sVar3 == 0)
     ) {
    return false;
  }
  iVar2 = JPCommon_get_label_size(in_RSI);
  if (2 < iVar2) {
    HTS_Engine_refresh((HTS_Engine *)0x19db16);
  }
  JPCommon_refresh((JPCommon *)0x19db24);
  NJD_refresh((NJD *)0x19db32);
  HVar1 = HTS_Engine_load(in_stack_00000028,in_stack_00000020,in_stack_00000018);
  if (HVar1 != '\x01') {
    Open_JTalk_clear((Open_JTalk *)0x19db5a);
    return false;
  }
  __s1 = HTS_Engine_get_fullcontext_label_format((HTS_Engine *)0x19db6f);
  iVar2 = strcmp(__s1,"HTS_TTS_JPN");
  if (iVar2 != 0) {
    Open_JTalk_clear((Open_JTalk *)0x19db8d);
    return false;
  }
  return true;
}

Assistant:

bool Open_JTalk_load_voice(Open_JTalk *open_jtalk, char *fn_voice)
{
	if (open_jtalk == NULL || fn_voice == NULL || strlen(fn_voice) == 0)
	{
		return false;
	}

	if (JPCommon_get_label_size(&open_jtalk->jpcommon) > 2)
	{
		HTS_Engine_refresh(&open_jtalk->engine);
	}
	JPCommon_refresh(&open_jtalk->jpcommon);
	NJD_refresh(&open_jtalk->njd);

	if (HTS_Engine_load(&open_jtalk->engine, &fn_voice, 1) != true)
	{
		Open_JTalk_clear(open_jtalk);
		return false;
	}
	if (strcmp(HTS_Engine_get_fullcontext_label_format(&open_jtalk->engine), "HTS_TTS_JPN") != 0)
	{
		Open_JTalk_clear(open_jtalk);
		return false;
	}
	return true;
}